

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_for_statement_tree(FILE *out,AST_For_Statement *fo)

{
  AST_For_Statement *fo_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"for(\n");
  print_ast(out,fo->initialisation);
  fprintf((FILE *)out,";\n");
  print_ast(out,fo->condition);
  fprintf((FILE *)out,";\n");
  print_ast(out,fo->update);
  fprintf((FILE *)out,")\n");
  print_ast(out,fo->body_statement);
  return;
}

Assistant:

void print_for_statement_tree(FILE *out,struct AST_For_Statement *fo)
{
	fprintf(out,"for(\n");
	print_ast(out,fo->initialisation);
	fprintf(out,";\n");
	print_ast(out,fo->condition);
	fprintf(out,";\n");
	print_ast(out,fo->update);
	fprintf(out,")\n");
	print_ast(out,fo->body_statement);
}